

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcGeometricRepresentationSubContext::~IfcGeometricRepresentationSubContext
          (IfcGeometricRepresentationSubContext *this)

{
  ~IfcGeometricRepresentationSubContext
            ((IfcGeometricRepresentationSubContext *)
             ((long)&(this->super_IfcGeometricRepresentationContext).super_IfcRepresentationContext.
                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>.
                     _vptr_ObjectHelper +
             (long)(this->super_IfcGeometricRepresentationContext).super_IfcRepresentationContext.
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>.
                   _vptr_ObjectHelper[-3]));
  return;
}

Assistant:

IfcGeometricRepresentationSubContext() : Object("IfcGeometricRepresentationSubContext") {}